

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlogin.c
# Opt level: O3

char * rlogin_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int iVar1;
  undefined8 *puVar2;
  Conf *pCVar3;
  char *pcVar4;
  SockAddr *addr;
  Socket *pSVar5;
  
  puVar2 = (undefined8 *)safemalloc(1,0x80,0);
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[0xf] = 0;
  puVar2[10] = &Rlogin_plugvt;
  puVar2[0xb] = vt;
  puVar2[0xd] = &Rlogin_interactorvt;
  puVar2[0xc] = (Interactor *)(puVar2 + 0xd);
  *puVar2 = 0;
  puVar2[4] = seat;
  puVar2[5] = logctx;
  iVar1 = conf_get_int(conf,0x7d);
  *(int *)((long)puVar2 + 0x14) = iVar1;
  iVar1 = conf_get_int(conf,0x7e);
  *(int *)(puVar2 + 3) = iVar1;
  *(undefined2 *)(puVar2 + 2) = 0x100;
  *(undefined1 *)((long)puVar2 + 0x12) = 0;
  puVar2[9] = 0;
  pCVar3 = conf_copy(conf);
  puVar2[8] = pCVar3;
  pcVar4 = default_description(vt,host,port);
  puVar2[7] = pcVar4;
  *backend_handle = (Backend *)(puVar2 + 0xb);
  iVar1 = conf_get_int(conf,3);
  addr = name_lookup(host,port,realhost,conf,iVar1,(LogContext *)puVar2[5],"rlogin connection");
  pcVar4 = sk_addr_error(addr);
  if (pcVar4 == (char *)0x0) {
    iVar1 = 0x201;
    if (-1 < port) {
      iVar1 = port;
    }
    pSVar5 = new_connection(addr,*realhost,iVar1,true,false,nodelay,keepalive,(Plug *)(puVar2 + 10),
                            conf,(Interactor *)(puVar2 + 0xd));
    *puVar2 = pSVar5;
    pcVar4 = (*pSVar5->vt->socket_error)(pSVar5);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = conf_get_str(conf,9);
      if (*pcVar4 != '\0') {
        safefree(*realhost);
        pcVar4 = dupstr(pcVar4);
        *realhost = pcVar4;
        pcVar4 = host_strrchr(pcVar4,0x3a);
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
      }
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar4 = dupstr(pcVar4);
  return pcVar4;
}

Assistant:

static char *rlogin_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Rlogin *rlogin;
    int addressfamily;
    char *loghost;

    rlogin = snew(Rlogin);
    memset(rlogin, 0, sizeof(Rlogin));
    rlogin->plug.vt = &Rlogin_plugvt;
    rlogin->backend.vt = vt;
    rlogin->interactor.vt = &Rlogin_interactorvt;
    rlogin->backend.interactor = &rlogin->interactor;
    rlogin->s = NULL;
    rlogin->closed_on_socket_error = false;
    rlogin->seat = seat;
    rlogin->logctx = logctx;
    rlogin->term_width = conf_get_int(conf, CONF_width);
    rlogin->term_height = conf_get_int(conf, CONF_height);
    rlogin->socket_connected = false;
    rlogin->firstbyte = true;
    rlogin->cansize = false;
    rlogin->prompt = NULL;
    rlogin->conf = conf_copy(conf);
    rlogin->description = default_description(vt, host, port);
    *backend_handle = &rlogin->backend;

    addressfamily = conf_get_int(conf, CONF_addressfamily);
    /*
     * Try to find host.
     */
    addr = name_lookup(host, port, realhost, conf, addressfamily,
                       rlogin->logctx, "rlogin connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 513;                    /* default rlogin port */

    /*
     * Open socket.
     */
    rlogin->s = new_connection(addr, *realhost, port, true, false,
                               nodelay, keepalive, &rlogin->plug, conf,
                               &rlogin->interactor);
    if ((err = sk_socket_error(rlogin->s)) != NULL)
        return dupstr(err);

    loghost = conf_get_str(conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}